

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_start.cpp
# Opt level: O2

void __thiscall FTTYStartupScreen::NetProgress(FTTYStartupScreen *this,int count)

{
  int iVar1;
  
  if (count == 0) {
    this->NetCurPos = this->NetCurPos + 1;
  }
  else if (0 < count) {
    this->NetCurPos = count;
  }
  if (this->NetMaxPos == 0) {
    fprintf(_stderr,"\r%s: %c",this->TheNetMessage,(ulong)(uint)(int)"|/-\\"[this->NetCurPos & 3]);
  }
  else {
    if (this->NetMaxPos < 2) {
      return;
    }
    iVar1 = 0;
    fprintf(_stderr,"\r%s: ",this->TheNetMessage);
    while( true ) {
      if (this->NetCurPos <= iVar1) break;
      fputc(0x2e,_stderr);
      iVar1 = iVar1 + 1;
    }
    fprintf(_stderr,"%*c[%2d/%2d]",(ulong)((this->NetMaxPos - this->NetCurPos) + 1),0x20);
  }
  fflush(_stderr);
  return;
}

Assistant:

void FTTYStartupScreen::NetProgress(int count)
{
	int i;

	if (count == 0)
	{
		NetCurPos++;
	}
	else if (count > 0)
	{
		NetCurPos = count;
	}
	if (NetMaxPos == 0)
	{
		// Spinny-type progress meter, because we're a guest waiting for the host.
		fprintf (stderr, "\r%s: %c", TheNetMessage, SpinnyProgressChars[NetCurPos & 3]);
		fflush (stderr);
	}
	else if (NetMaxPos > 1)
	{
		// Dotty-type progress meter.
		fprintf (stderr, "\r%s: ", TheNetMessage);
		for (i = 0; i < NetCurPos; ++i)
		{
			fputc ('.', stderr);
		}
		fprintf (stderr, "%*c[%2d/%2d]", NetMaxPos + 1 - NetCurPos, ' ', NetCurPos, NetMaxPos);
		fflush (stderr);
	}
}